

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzmatrix.cpp
# Opt level: O2

complex<double> __thiscall
TPZMatrix<std::complex<double>_>::ConditionNumber
          (TPZMatrix<std::complex<double>_> *this,int p,int64_t numiter,REAL tol)

{
  int iVar1;
  ostream *poVar2;
  undefined8 extraout_RAX;
  undefined8 extraout_RDX;
  complex<double> cVar3;
  complex<double> thisnorm;
  complex<double> invnorm;
  TPZFMatrix<std::complex<double>_> Inv;
  complex<double> local_c8;
  complex<double> local_b8;
  TPZFMatrix<std::complex<double>_> local_a8;
  
  TPZFMatrix<std::complex<double>_>::TPZFMatrix(&local_a8);
  MatrixNorm(this,p,numiter,tol);
  iVar1 = Inverse(this,&local_a8,ENoDecompose);
  if (iVar1 == 0) {
    poVar2 = std::operator<<((ostream *)&std::cerr,
                             "TVar TPZMatrix<std::complex<double>>::ConditionNumber(int, int64_t, REAL) [TVar = std::complex<double>]"
                            );
    poVar2 = std::operator<<(poVar2," - it was not possible to compute the inverse matrix.");
    std::endl<char,std::char_traits<char>>(poVar2);
  }
  else {
    MatrixNorm(&local_a8.super_TPZMatrix<std::complex<double>_>,p,numiter,tol);
    std::operator*(&local_c8,&local_b8);
  }
  TPZFMatrix<std::complex<double>_>::~TPZFMatrix(&local_a8);
  cVar3._M_value._8_8_ = extraout_RDX;
  cVar3._M_value._0_8_ = extraout_RAX;
  return (complex<double>)cVar3._M_value;
}

Assistant:

TVar TPZMatrix<TVar>::ConditionNumber(int p, int64_t numiter, REAL tol){
	int64_t localnumiter = numiter;
	REAL localtol = tol;
	TPZFMatrix<TVar> Inv;
	TVar thisnorm = this->MatrixNorm(p, localnumiter, localtol);
	if (!this->Inverse(Inv,ENoDecompose)){
		PZError << __PRETTY_FUNCTION__ << " - it was not possible to compute the inverse matrix." << std:: endl;
		return 0.;
	}
	TVar invnorm = Inv.MatrixNorm(p, numiter, tol);
	return thisnorm * invnorm;
}